

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

uint rotateModulo(uint BitWidth,APInt *rotateAmt)

{
  bool bVar1;
  anon_union_8_2_1313ab2f_for_U __dest;
  uint64_t uVar2;
  ulong __n;
  uint numBits;
  anon_union_8_2_1313ab2f_for_U local_58;
  uint local_50;
  anon_union_8_2_1313ab2f_for_U local_48;
  uint local_40;
  anon_union_8_2_1313ab2f_for_U local_38;
  uint local_30;
  
  numBits = rotateAmt->BitWidth;
  local_50 = numBits;
  if ((ulong)numBits < 0x41) {
    __dest = rotateAmt->U;
  }
  else {
    __n = (ulong)((uint)((ulong)numBits + 0x3f >> 3) & 0xfffffff8);
    __dest.pVal = (uint64_t *)operator_new__(__n);
    memcpy(__dest.pVal,(rotateAmt->U).pVal,__n);
  }
  local_58 = __dest;
  if (numBits < BitWidth) {
    llvm::APInt::zext((APInt *)&local_48,(uint)rotateAmt);
    llvm::APInt::operator=((APInt *)&local_58,(APInt *)&local_48);
    numBits = local_50;
    if ((0x40 < local_40) && ((void *)local_48.VAL != (void *)0x0)) {
      operator_delete__(local_48.pVal);
      numBits = local_50;
    }
  }
  llvm::APInt::APInt((APInt *)&local_38,numBits,(ulong)BitWidth,false);
  llvm::APInt::urem((APInt *)&local_48,(APInt *)&local_58);
  llvm::APInt::operator=((APInt *)&local_58,(APInt *)&local_48);
  if ((0x40 < local_40) && ((void *)local_48.VAL != (void *)0x0)) {
    operator_delete__(local_48.pVal);
  }
  if ((0x40 < local_30) && ((void *)local_38.VAL != (void *)0x0)) {
    operator_delete__(local_38.pVal);
  }
  bVar1 = llvm::APInt::ugt((APInt *)&local_58,(ulong)BitWidth);
  if (!bVar1) {
    uVar2 = llvm::APInt::getZExtValue((APInt *)&local_58);
    BitWidth = (uint)uVar2;
  }
  if ((0x40 < local_50) && (local_58.VAL != 0)) {
    operator_delete__(local_58.pVal);
  }
  return BitWidth;
}

Assistant:

static unsigned rotateModulo(unsigned BitWidth, const APInt &rotateAmt) {
  unsigned rotBitWidth = rotateAmt.getBitWidth();
  APInt rot = rotateAmt;
  if (rotBitWidth < BitWidth) {
    // Extend the rotate APInt, so that the urem doesn't divide by 0.
    // e.g. APInt(1, 32) would give APInt(1, 0).
    rot = rotateAmt.zext(BitWidth);
  }
  rot = rot.urem(APInt(rot.getBitWidth(), BitWidth));
  return rot.getLimitedValue(BitWidth);
}